

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_def_read
                   (Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *nread,
                   _Bool *eos)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  
  pCVar1 = reader->next;
  if (pCVar1 != (Curl_creader *)0x0) {
    CVar2 = (*pCVar1->crt->do_read)(data,pCVar1,buf,blen,nread,eos);
    return CVar2;
  }
  *nread = 0;
  *eos = false;
  return CURLE_READ_ERROR;
}

Assistant:

CURLcode Curl_creader_def_read(struct Curl_easy *data,
                               struct Curl_creader *reader,
                               char *buf, size_t blen,
                               size_t *nread, bool *eos)
{
  if(reader->next)
    return reader->next->crt->do_read(data, reader->next, buf, blen,
                                      nread, eos);
  else {
    *nread = 0;
    *eos = FALSE;
    return CURLE_READ_ERROR;
  }
}